

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XPathScanner::scanNumber
          (XPathScanner *this,XMLCh *data,XMLSize_t endOffset,XMLSize_t currentOffset,
          ValueVectorOf<int> *tokens)

{
  RuntimeException *this_00;
  MemoryManager *memoryManager;
  int local_3c;
  int local_38;
  int part;
  int whole;
  XMLCh ch;
  ValueVectorOf<int> *tokens_local;
  XMLSize_t currentOffset_local;
  XMLSize_t endOffset_local;
  XMLCh *data_local;
  XPathScanner *this_local;
  
  part._2_2_ = data[currentOffset];
  local_38 = 0;
  local_3c = 0;
  tokens_local = (ValueVectorOf<int> *)currentOffset;
  while (0x2f < (ushort)part._2_2_ && (ushort)part._2_2_ < 0x3a) {
    local_38 = local_38 * 10 + ((ushort)part._2_2_ - 0x30);
    tokens_local = (ValueVectorOf<int> *)&tokens_local->field_0x1;
    if (tokens_local == (ValueVectorOf<int> *)endOffset) break;
    part._2_2_ = data[(long)tokens_local];
  }
  _whole = tokens;
  currentOffset_local = endOffset;
  endOffset_local = (XMLSize_t)data;
  data_local = (XMLCh *)this;
  if ((part._2_2_ == L'.') &&
     (tokens_local = (ValueVectorOf<int> *)&tokens_local->field_0x1, tokens_local < endOffset)) {
    part._2_2_ = data[(long)tokens_local];
    while (0x2f < (ushort)part._2_2_ && (ushort)part._2_2_ < 0x3a) {
      local_3c = local_3c * 10 + ((ushort)part._2_2_ - 0x30);
      tokens_local = (ValueVectorOf<int> *)&tokens_local->field_0x1;
      if (tokens_local == (ValueVectorOf<int> *)endOffset) break;
      part._2_2_ = data[(long)tokens_local];
    }
    if (local_3c != 0) {
      this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
      memoryManager = ValueVectorOf<int>::getMemoryManager(_whole);
      RuntimeException::RuntimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x580,XPath_FindSolution,memoryManager);
      __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
  }
  ValueVectorOf<int>::addElement(tokens,&local_38);
  ValueVectorOf<int>::addElement(_whole,&local_3c);
  return (XMLSize_t)tokens_local;
}

Assistant:

XMLSize_t XPathScanner::scanNumber(const XMLCh* const data,
                             const XMLSize_t endOffset,
                             XMLSize_t currentOffset,
                             ValueVectorOf<int>* const tokens) {

    XMLCh ch = data[currentOffset];
    int   whole = 0;
    int   part = 0;

    while (ch >= chDigit_0 && ch <= chDigit_9) {

        whole = (whole * 10) + (ch - chDigit_0);

        if (++currentOffset == endOffset) {
            break;
        }

        ch = data[currentOffset];
    }

    if (ch == chPeriod) {

        if (++currentOffset < endOffset) {

            ch = data[currentOffset];

            while (ch >= chDigit_0 && ch <= chDigit_9) {

                part = (part * 10) + (ch - chDigit_0);

                if (++currentOffset == endOffset) {
                    break;
                }

                ch = data[currentOffset];
            }

            if (part != 0) {
                ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::XPath_FindSolution, tokens->getMemoryManager());
            }
        }
    }

    tokens->addElement(whole);
    tokens->addElement(part);

    return currentOffset;
}